

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  out_edge_t peVar2;
  bitmap_t bm;
  uint uVar3;
  int iVar4;
  MIR_insn_t pMVar5;
  DLIST_in_edge_t *pDVar6;
  uint uVar7;
  DLIST_out_edge_t *pDVar8;
  DLIST_bb_insn_t *pDVar9;
  bb_insn_t pbVar10;
  long lVar11;
  
  pDVar8 = &bb->out_edges;
  uVar7 = 0;
  do {
    peVar1 = pDVar8->head;
    if (peVar1 == (out_edge_t)0x0) {
      return uVar7;
    }
    uVar3 = bitmap_ior(bb->out,bb->out,peVar1->dst->in);
    uVar7 = uVar3 | uVar7;
    if (gen_ctx->lr_ctx->ssa_live_info_p != 0) {
      pDVar9 = &peVar1->dst->bb_insns;
      while (pbVar10 = pDVar9->head, pbVar10 != (bb_insn_t)0x0) {
        pMVar5 = pbVar10->insn;
        if (*(int *)&pMVar5->field_0x18 != 0xb4) {
          if (*(int *)&pMVar5->field_0x18 == 0xba) {
            lVar11 = 0x60;
            pDVar6 = &peVar1->dst->in_edges;
            while ((peVar2 = pDVar6->head, peVar2 != (out_edge_t)0x0 && (peVar2 != peVar1))) {
              lVar11 = lVar11 + 0x30;
              pDVar6 = (DLIST_in_edge_t *)&(peVar2->in_link).next;
            }
            if (peVar2 != peVar1) {
              __assert_fail("e2 == e",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1732,"int live_con_func_n(gen_ctx_t, bb_t)");
            }
            do {
              if (*(char *)((long)pMVar5->ops + lVar11 + -0x28) == '\x02') {
                bm = bb->out;
                iVar4 = var_to_scan_var(gen_ctx,*(MIR_reg_t *)((long)pMVar5->ops + lVar11 + -0x20));
                uVar3 = bitmap_set_bit_p(bm,(long)iVar4);
                uVar7 = uVar7 | uVar3;
              }
              pbVar10 = (pbVar10->bb_insn_link).next;
            } while ((pbVar10 != (bb_insn_t)0x0) &&
                    (pMVar5 = pbVar10->insn, *(int *)&pMVar5->field_0x18 == 0xba));
          }
          break;
        }
        pDVar9 = (DLIST_bb_insn_t *)&(pbVar10->bb_insn_link).next;
      }
    }
    pDVar8 = (DLIST_out_edge_t *)&(peVar1->out_link).next;
  } while( true );
}

Assistant:

static int live_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_op_t *op_ref;
  bb_insn_t bb_insn;
  edge_t e, e2;
  int n, change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    change_p |= bitmap_ior (bb->live_out, bb->live_out, e->dst->live_in);
    if (ssa_live_info_p) {
      for (bb_insn = DLIST_HEAD (bb_insn_t, e->dst->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
        if (bb_insn->insn->code != MIR_LABEL) break;
      if (bb_insn == NULL || bb_insn->insn->code != MIR_PHI) continue; /* no phis in dst */
      for (n = 1, e2 = DLIST_HEAD (in_edge_t, e->dst->in_edges); e2 != NULL;
           e2 = DLIST_NEXT (in_edge_t, e2), n++)
        if (e2 == e) break;
      gen_assert (e2 == e);
      for (;;) {
        op_ref = &bb_insn->insn->ops[n];
        if (op_ref->mode == MIR_OP_VAR)
          change_p |= bitmap_set_bit_p (bb->live_out, var_to_scan_var (gen_ctx, op_ref->u.var));
        if ((bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) == NULL || bb_insn->insn->code != MIR_PHI)
          break;
      }
    }
  }
  return change_p;
}